

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

int icu_63::number::impl::PatternStringUtils::escapePaddingString
              (UnicodeString *input,UnicodeString *output,int startIndex,UErrorCode *status)

{
  UnicodeString *pUVar1;
  int8_t iVar2;
  int32_t iVar3;
  int iVar4;
  ConstChar16Ptr local_68;
  char16_t local_5a;
  int local_58;
  int iStack_54;
  char16_t ch;
  int i;
  int offset;
  ConstChar16Ptr local_38;
  int32_t local_2c;
  UErrorCode *pUStack_28;
  int startLength;
  UErrorCode *status_local;
  UnicodeString *pUStack_18;
  int startIndex_local;
  UnicodeString *output_local;
  UnicodeString *input_local;
  
  pUStack_28 = status;
  status_local._4_4_ = startIndex;
  pUStack_18 = output;
  output_local = input;
  iVar3 = UnicodeString::length(input);
  if (iVar3 == 0) {
    UnicodeString::setTo(input,L" ",-1);
  }
  local_2c = UnicodeString::length(pUStack_18);
  iVar3 = UnicodeString::length(input);
  if (iVar3 == 1) {
    ConstChar16Ptr::ConstChar16Ptr(&local_38,L"\'");
    iVar2 = UnicodeString::compare(input,&local_38,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_38);
    pUVar1 = pUStack_18;
    iVar3 = status_local._4_4_;
    if (iVar2 == '\0') {
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&i,L"\'\'");
      UnicodeString::insert(pUVar1,iVar3,(ConstChar16Ptr *)&i,-1);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&i);
    }
    else {
      UnicodeString::insert(pUStack_18,status_local._4_4_,input);
    }
  }
  else {
    UnicodeString::insert(pUStack_18,status_local._4_4_,L'\'');
    iStack_54 = 1;
    for (local_58 = 0; iVar4 = local_58, iVar3 = UnicodeString::length(input), iVar4 < iVar3;
        local_58 = local_58 + 1) {
      local_5a = UnicodeString::charAt(input,local_58);
      pUVar1 = pUStack_18;
      if (local_5a == L'\'') {
        iVar4 = status_local._4_4_ + iStack_54;
        ConstChar16Ptr::ConstChar16Ptr(&local_68,L"\'\'");
        UnicodeString::insert(pUVar1,iVar4,&local_68,-1);
        ConstChar16Ptr::~ConstChar16Ptr(&local_68);
        iStack_54 = iStack_54 + 2;
      }
      else {
        UnicodeString::insert(pUStack_18,status_local._4_4_ + iStack_54,local_5a);
        iStack_54 = iStack_54 + 1;
      }
    }
    UnicodeString::insert(pUStack_18,status_local._4_4_ + iStack_54,L'\'');
  }
  iVar3 = UnicodeString::length(pUStack_18);
  return iVar3 - local_2c;
}

Assistant:

int PatternStringUtils::escapePaddingString(UnicodeString input, UnicodeString& output, int startIndex,
                                            UErrorCode& status) {
    (void) status;
    if (input.length() == 0) {
        input.setTo(kFallbackPaddingString, -1);
    }
    int startLength = output.length();
    if (input.length() == 1) {
        if (input.compare(u"'", -1) == 0) {
            output.insert(startIndex, u"''", -1);
        } else {
            output.insert(startIndex, input);
        }
    } else {
        output.insert(startIndex, u'\'');
        int offset = 1;
        for (int i = 0; i < input.length(); i++) {
            // it's okay to deal in chars here because the quote mark is the only interesting thing.
            char16_t ch = input.charAt(i);
            if (ch == u'\'') {
                output.insert(startIndex + offset, u"''", -1);
                offset += 2;
            } else {
                output.insert(startIndex + offset, ch);
                offset += 1;
            }
        }
        output.insert(startIndex + offset, u'\'');
    }
    return output.length() - startLength;
}